

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

void doFormatString<std::__cxx11::wstring_const,std::__cxx11::wstring,unsigned_long>
               (wstringstream *stream,wchar_t *format,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *first,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *rest,
               unsigned_long *rest_1)

{
  wchar_t wVar1;
  bool bVar2;
  unsigned_long *rest_local_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *rest_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *first_local;
  wchar_t *format_local;
  wstringstream *stream_local;
  
  first_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)format
  ;
  format_local = (wchar_t *)stream;
  while( true ) {
    if (*(int *)first_local == 0) {
      return;
    }
    if (*(int *)first_local == 0x25) break;
    wVar1 = *(wchar_t *)first_local;
    first_local = first_local + 4;
    std::operator<<((wostream *)(format_local + 4),wVar1);
  }
  first_local = first_local + 4;
  bVar2 = doFormatSetup((wstringstream *)format_local,(wchar_t **)&first_local);
  if (bVar2) {
    std::operator<<((wostream *)(format_local + 4),(wstring *)first);
  }
  doFormatString<std::__cxx11::wstring_const,unsigned_long>
            ((wstringstream *)format_local,(wchar_t *)first_local,rest,rest_1);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}